

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHullHelpers.cpp
# Opt level: O0

Polygon * iDynTree::Polygon::XYRectangleFromOffsets
                    (double front,double back,double left,double right)

{
  Polygon *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  double in_XMM3_Qa;
  Polygon *ret;
  value_type *in_stack_ffffffffffffff28;
  vector<iDynTree::Position,_std::allocator<iDynTree::Position>_> *in_stack_ffffffffffffff30;
  Polygon *this;
  Position local_a0 [24];
  Position local_88 [24];
  Position local_70 [40];
  Position local_48 [31];
  undefined1 local_29;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  local_20 = (double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
  local_29 = 0;
  this = in_RDI;
  local_28 = in_XMM3_Qa;
  local_18 = in_XMM1_Qa;
  local_10 = in_XMM0_Qa;
  Polygon(in_RDI);
  iDynTree::Position::Position(local_48,local_10,local_20,0.0);
  std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::push_back
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  iDynTree::Position::Position(local_70,-local_18,local_20,0.0);
  std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::push_back
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  iDynTree::Position::Position(local_88,-local_18,-local_28,0.0);
  std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::push_back
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  iDynTree::Position::Position(local_a0,local_10,-local_28,0.0);
  std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::push_back
            (&this->m_vertices,in_stack_ffffffffffffff28);
  return in_RDI;
}

Assistant:

Polygon Polygon::XYRectangleFromOffsets(const double front, const double back, const double left, const double right)
    {
        Polygon ret;
        ret.m_vertices.push_back(iDynTree::Position(front,left,0.0));
        ret.m_vertices.push_back(iDynTree::Position(-back,left,0.0));
        ret.m_vertices.push_back(iDynTree::Position(-back,-right,0.0));
        ret.m_vertices.push_back(iDynTree::Position(front,-right,0.0));

        return ret;
    }